

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  SPxOut *pSVar1;
  type_conflict5 tVar2;
  bool bVar3;
  Result RVar4;
  int iVar5;
  int iVar6;
  Verbosity VVar7;
  int *piVar8;
  char *pcVar9;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar10;
  element_type *peVar11;
  bool *pbVar12;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  ulong *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  undefined1 *in_RDX;
  long *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_1;
  int i_6;
  int i_5;
  int *perm;
  int nRowsOld;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  DataArray<int> da_perm_empty;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int j_2;
  DataArray<int> da_perm;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newRhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scaledRhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scaledLhs;
  int i_4;
  int l_2;
  DataArray<bool> isLhsEqualRhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxLhs;
  int minRhsIdx;
  int maxLhsIdx;
  int rowIdx;
  int k_5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  bool doChangeRanges;
  int j_tmp;
  int k_tmp;
  int i_3;
  int l_1;
  int k_4;
  int numDelRows;
  int idxLastDupRows;
  int idxFirstDupRows;
  int j_1;
  int *perm_tmp;
  int nRowsOld_tmp;
  int k_3;
  int k_2;
  DataArray<bool> remRow;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int i_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldVal;
  int i_1;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Verbosity old_verbosity;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  int rs_remRows;
  Result ret;
  int oldRows;
  int remNzos;
  int remRows;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  DuplicateRowsPS *in_stack_ffffffffffffec98;
  int i_00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffeca0;
  DataArray<bool> *in_stack_ffffffffffffeca8;
  undefined4 in_stack_ffffffffffffecb0;
  undefined4 in_stack_ffffffffffffecb4;
  undefined4 in_stack_ffffffffffffecd8;
  int in_stack_ffffffffffffecdc;
  int **in_stack_ffffffffffffece0;
  undefined1 *puVar16;
  undefined4 in_stack_ffffffffffffed20;
  undefined1 in_stack_ffffffffffffed24;
  undefined1 in_stack_ffffffffffffed25;
  undefined1 in_stack_ffffffffffffed26;
  undefined1 in_stack_ffffffffffffed27;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffed28;
  undefined7 in_stack_ffffffffffffed30;
  undefined1 in_stack_ffffffffffffed37;
  undefined8 in_stack_ffffffffffffed38;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed88;
  undefined7 in_stack_ffffffffffffed90;
  undefined1 in_stack_ffffffffffffed97;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffee28;
  undefined7 in_stack_ffffffffffffee30;
  undefined1 in_stack_ffffffffffffee37;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffee38;
  undefined1 *in_stack_ffffffffffffee40;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee48;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffeec0;
  DataArray<int> *in_stack_ffffffffffffeec8;
  undefined7 in_stack_ffffffffffffeed0;
  byte in_stack_ffffffffffffeed7;
  uint uVar17;
  bool local_108d;
  undefined1 local_ff0 [56];
  undefined4 local_fb8;
  Verbosity local_fb4;
  int local_fb0;
  int local_fac;
  long local_fa8;
  int local_f9c;
  int local_f98;
  undefined1 local_f5c [56];
  undefined1 local_f24 [59];
  undefined1 local_ee9;
  undefined1 local_ec8 [56];
  undefined1 local_e90 [56];
  DataArray<bool> local_e58 [4];
  undefined1 local_de1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_de0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff270;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff278;
  DataArray<bool> local_d50;
  undefined1 local_d38 [68];
  int local_cf4;
  DataArray<int> local_cf0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cd8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ca0;
  SPxOut *local_c68;
  undefined1 local_c60 [56];
  undefined1 local_c28 [56];
  pointer local_bf0;
  undefined1 local_be8 [56];
  undefined1 local_bb0 [56];
  undefined1 local_b78 [56];
  undefined1 local_b40 [56];
  ulong local_b08;
  ulong local_b00;
  undefined1 local_af4 [56];
  undefined1 local_abc [56];
  undefined4 local_a84;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a80;
  undefined1 local_a48 [56];
  undefined1 local_a10 [56];
  int local_9d8;
  uint local_9d4;
  DataArray<bool> local_9d0;
  undefined1 local_9b8 [40];
  int *in_stack_fffffffffffff670;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff678;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff680;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff688;
  ulong local_948;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_93c;
  int local_904;
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  undefined1 local_8f0 [24];
  undefined1 local_8d8 [27];
  byte local_8bd;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  uint local_8b0;
  int local_8ac;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  long local_898;
  int local_88c;
  undefined8 local_888;
  undefined1 local_880 [56];
  int local_848;
  int local_844;
  DataArray<bool> local_840 [3];
  undefined1 local_7f0 [56];
  undefined1 local_7b8 [56];
  uint local_780;
  int local_77c;
  Real local_768;
  undefined1 local_760 [112];
  int local_6f0;
  uint local_6ec;
  undefined1 local_6e8 [56];
  undefined8 local_6b0;
  int local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6a4;
  uint local_66c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_668;
  int local_65c;
  undefined8 local_658;
  undefined1 local_650 [56];
  undefined8 local_618;
  int local_60c;
  undefined8 local_608;
  IdxSet local_600;
  int *local_5d8;
  DataArray<int> local_5a8;
  DataArray<int> local_590;
  undefined4 local_578;
  Verbosity local_574;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_570;
  int local_568;
  int local_564;
  undefined4 local_560;
  int local_55c;
  int local_558;
  int local_554;
  undefined1 *local_550;
  long *local_548;
  Result local_534;
  undefined8 local_530;
  undefined8 *local_528;
  undefined1 *local_520;
  undefined8 local_518;
  Real *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  ulong *local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  ulong *local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  ulong *local_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined1 *local_448;
  undefined8 local_440;
  pointer *local_438;
  undefined1 *local_430;
  undefined8 local_428;
  SPxOut **local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined1 *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  uint *local_380;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  undefined1 *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined1 *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  undefined1 *local_2a0;
  DataArray<int> *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined8 local_268;
  SPxOut **local_260;
  pointer *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  ulong *local_238;
  ulong *local_230;
  undefined8 local_228;
  ulong *local_220;
  undefined8 *local_218;
  Real *local_210;
  undefined8 *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  undefined8 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined8 *local_58;
  long local_50;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_41;
  int *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  int *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  
  local_554 = 0;
  local_558 = 0;
  local_550 = in_RDX;
  local_548 = in_RSI;
  local_55c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4132c3);
  RVar4 = removeEmpty(in_stack_fffffffffffff278,in_stack_fffffffffffff270);
  if (RVar4 == OKAY) {
    local_564 = 0;
    local_560 = 0;
    for (local_568 = 0; iVar6 = local_568,
        iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x413334), iVar6 < iVar5; local_568 = local_568 + 1) {
      local_570 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rowVector(in_stack_ffffffffffffeca0,
                              (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
      iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(local_570);
      if (iVar6 == 1) {
        removeRowSingleton(in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                           in_stack_fffffffffffff678,in_stack_fffffffffffff670);
        local_564 = local_564 + 1;
      }
    }
    if (((0 < local_564) &&
        ((in_RDI->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout != (SPxOut *)0x0)) &&
       (VVar7 = SPxOut::getVerbosity
                          ((in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout), 3 < (int)VVar7)) {
      local_574 = SPxOut::getVerbosity
                            ((in_RDI->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).spxout);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_578 = 4;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_578);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                         (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                         (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
      soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffec98);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_574);
    }
    iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x4134dd);
    if (iVar6 < 2) {
      local_534 = OKAY;
      RVar4 = local_534;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x4134ff);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),(int)in_stack_ffffffffffffeca8,
                 (Real)in_stack_ffffffffffffeca0);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x413525);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),(int)in_stack_ffffffffffffeca8,
                 (Real)in_stack_ffffffffffffeca0);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x41355b);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
              (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20));
      local_5d8 = (int *)0x0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x413593);
      spx_alloc<int*>(in_stack_ffffffffffffece0,in_stack_ffffffffffffecdc);
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4136ca);
      IdxSet::IdxSet(&local_600,iVar6,local_5d8,0);
      piVar8 = DataArray<int>::operator[](&local_590,0);
      *piVar8 = 0;
      local_608 = 0;
      local_60 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_ffffffffffffeca0,
                              (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
      local_68 = &local_608;
      local_58 = local_68;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_ffffffffffffed28,
                 (double)CONCAT17(in_stack_ffffffffffffed27,
                                  CONCAT16(in_stack_ffffffffffffed26,
                                           CONCAT15(in_stack_ffffffffffffed25,
                                                    CONCAT14(in_stack_ffffffffffffed24,
                                                             in_stack_ffffffffffffed20)))));
      iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x413781);
      piVar8 = DataArray<int>::operator[](&local_5a8,0);
      *piVar8 = iVar6;
      for (local_60c = 1; iVar6 = local_60c,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x4137c8), iVar6 < iVar5; local_60c = local_60c + 1) {
        piVar8 = DataArray<int>::operator[](&local_590,local_60c);
        *piVar8 = 0;
        local_618 = 0;
        local_78 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffeca0,
                                (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        local_80 = &local_618;
        local_70 = local_80;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_ffffffffffffed28,
                   (double)CONCAT17(in_stack_ffffffffffffed27,
                                    CONCAT16(in_stack_ffffffffffffed26,
                                             CONCAT15(in_stack_ffffffffffffed25,
                                                      CONCAT14(in_stack_ffffffffffffed24,
                                                               in_stack_ffffffffffffed20)))));
        piVar8 = DataArray<int>::operator[](&local_5a8,local_60c);
        *piVar8 = 0;
        IdxSet::addIdx(&local_600,local_60c);
      }
      local_658 = 0;
      local_520 = local_650;
      local_528 = &local_658;
      local_530 = 0;
      local_208 = local_528;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                 (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
      for (local_65c = 0; iVar6 = local_65c,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x41396b), iVar6 < iVar5; local_65c = local_65c + 1) {
        local_668 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector(in_stack_ffffffffffffeca0,
                                (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        for (local_66c = 0; uVar17 = local_66c,
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_668), (int)uVar17 < iVar6; local_66c = local_66c + 1) {
          local_3e8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value(local_668,local_66c);
          local_3e0 = &local_6a4;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
          pcVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::index(local_668,(char *)(ulong)local_66c,__c);
          local_6a8 = (int)pcVar9;
          Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20))
          ;
          local_6b0 = 0;
          tVar2 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffec98,(double *)0x413a7b);
          if (tVar2) {
            local_270 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
            local_278 = &local_6a4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                       (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
          }
          DataArray<int>::operator[](&local_590,local_6a8);
          Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20))
          ;
          local_1b8 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          local_1b0 = &local_6a4;
          local_1a8 = local_6e8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1b9,local_1b0,local_1b8);
          local_1a0 = local_6e8;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
          local_190 = local_1b0;
          local_198 = local_1b8;
          local_188 = local_6e8;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                     (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                     (cpp_dec_float<50U,_int,_void> *)0x413be5);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_ffffffffffffeca0);
          piVar8 = DataArray<int>::operator[](&local_590,local_6a8);
          piVar8 = DataArray<int>::operator[](&local_5a8,*piVar8);
          iVar6 = *piVar8;
          *piVar8 = iVar6 + -1;
          if (iVar6 + -1 == 0) {
            piVar8 = DataArray<int>::operator[](&local_590,local_6a8);
            IdxSet::addIdx(&local_600,*piVar8);
          }
        }
        for (local_6ec = 0; uVar17 = local_6ec,
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_668), (int)uVar17 < iVar6; local_6ec = local_6ec + 1) {
          pcVar9 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::index(local_668,(char *)(ulong)local_6ec,__c_00);
          piVar8 = DataArray<int>::operator[](&local_590,(int)pcVar9);
          local_6f0 = *piVar8;
          pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffeca0,
                                 (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(&pDVar10->
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
          if (0 < iVar6) {
            SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffec98);
            peVar11 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x413d31);
            local_768 = Tolerances::epsilon(peVar11);
            local_508 = local_760;
            local_510 = &local_768;
            local_518 = 0;
            local_210 = local_510;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                       (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
            ElementCompare::ElementCompare
                      ((ElementCompare *)in_stack_ffffffffffffeca8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffeca0);
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x413dd7);
            pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
            iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar10->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            iVar6 = extraout_EDX;
            if (1 < iVar5) {
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::mem(&pDVar10->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(&pDVar10->
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (in_stack_ffffffffffffed40,(int)((ulong)in_stack_ffffffffffffed38 >> 0x20),
                         (ElementCompare *)
                         CONCAT17(in_stack_ffffffffffffed37,in_stack_ffffffffffffed30),
                         (int)((ulong)in_stack_ffffffffffffed28 >> 0x20),
                         SUB81((ulong)in_stack_ffffffffffffed28 >> 0x18,0));
              iVar6 = extraout_EDX_00;
            }
            pcVar9 = IdxSet::index(&local_600,(char *)0x0,iVar6);
            local_77c = (int)pcVar9;
            IdxSet::remove(&local_600,(char *)0x0);
            local_780 = 0;
            while( true ) {
              uVar17 = local_780;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar10->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar5 = (int)((ulong)in_stack_ffffffffffffec98 >> 0x20);
              if (iVar6 <= (int)uVar17) break;
              local_108d = false;
              iVar6 = extraout_EDX_01;
              if (local_780 != 0) {
                pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)in_stack_ffffffffffffeca0,iVar5);
                local_3d8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(&pDVar10->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,local_780);
                local_3d0 = local_7b8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                local_3c0 = local_7f0;
                local_3c8 = local_650;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                epsZero((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8));
                local_108d = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT17(in_stack_ffffffffffffed97,
                                                    in_stack_ffffffffffffed90),
                                        in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
                iVar6 = extraout_EDX_02;
              }
              if (local_108d != false) {
                pcVar9 = IdxSet::index(&local_600,(char *)0x0,iVar6);
                local_77c = (int)pcVar9;
                IdxSet::remove(&local_600,(char *)0x0);
              }
              iVar6 = local_77c;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              piVar8 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar10->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_780,__c_01);
              piVar8 = DataArray<int>::operator[](&local_590,*piVar8);
              *piVar8 = iVar6;
              piVar8 = DataArray<int>::operator[](&local_5a8,local_77c);
              *piVar8 = *piVar8 + 1;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              local_288 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::value(&pDVar10->
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,local_780);
              local_280 = local_650;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              local_780 = local_780 + 1;
            }
            Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)in_stack_ffffffffffffeca0,iVar5);
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x41414a);
          }
        }
      }
      spx_free<int*>((int **)0x414187);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x414194);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                 (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),(int)in_stack_ffffffffffffeca8,
                 (Real)in_stack_ffffffffffffeca0);
      for (local_844 = 0; iVar6 = local_844,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x4141e3), iVar6 < iVar5; local_844 = local_844 + 1) {
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x414225);
      }
      for (local_848 = 0; iVar6 = local_848,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x414277), iVar6 < iVar5; local_848 = local_848 + 1) {
        pbVar12 = DataArray<bool>::operator[](local_840,local_848);
        *pbVar12 = false;
        DataArray<int>::operator[](&local_590,local_848);
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        local_888 = 0;
        local_4f0 = local_880;
        local_4f8 = &local_888;
        local_500 = 0;
        local_218 = local_4f8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                   (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
              (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)in_stack_ffffffffffffeca0);
      }
      local_88c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x4143ab);
      local_898 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffece0,in_stack_ffffffffffffecdc);
      for (local_89c = 0; local_89c < local_88c; local_89c = local_89c + 1) {
        *(undefined4 *)(local_898 + (long)local_89c * 4) = 0;
      }
      local_8a0 = -1;
      local_8a4 = -1;
      local_8a8 = 0;
      for (local_8ac = 0; iVar6 = local_8ac,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x414470), iVar6 < iVar5; local_8ac = local_8ac + 1) {
        pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)in_stack_ffffffffffffeca0,
                               (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar10->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar6) {
          pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffeca0,
                                 (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar10->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_02);
          pSVar13 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector(in_stack_ffffffffffffeca0,
                                (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar13);
          if (iVar6 != 1) {
            local_8a4 = local_8ac;
            if (local_8a0 < 0) {
              local_8a0 = local_8ac;
            }
            local_8b0 = 1;
            while( true ) {
              uVar17 = local_8b0;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar10->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar5 = (int)((ulong)in_stack_ffffffffffffec98 >> 0x20);
              if (iVar6 <= (int)uVar17) break;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,iVar5);
              piVar8 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar10->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_8b0,__c_03);
              local_8b4 = *piVar8;
              *(undefined4 *)(local_898 + (long)local_8b4 * 4) = 0xffffffff;
              local_8b0 = local_8b0 + 1;
            }
            pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffeca0,iVar5);
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar10->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            local_8a8 = iVar6 + -1 + local_8a8;
          }
        }
      }
      local_8bc = 0;
      for (local_8b8 = 0; local_8b8 < local_88c; local_8b8 = local_8b8 + 1) {
        if (-1 < *(int *)(local_898 + (long)local_8b8 * 4)) {
          *(int *)(local_898 + (long)local_8b8 * 4) = local_8bc;
          local_8bc = local_8bc + 1;
        }
      }
      local_8bd = 0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x4146e5);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffeca0,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffec98);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x414713);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffeca0,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_ffffffffffffec98);
      for (local_8f4 = 0; iVar6 = local_8f4,
          iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x41475a), iVar6 < iVar5; local_8f4 = local_8f4 + 1) {
        pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)in_stack_ffffffffffffeca0,
                               (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
        iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar10->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar6) {
          pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)in_stack_ffffffffffffeca0,
                                 (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar10->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_04);
          pSVar13 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector(in_stack_ffffffffffffeca0,
                                (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar13);
          if (iVar6 != 1) {
            pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
            local_8f8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::size(&pDVar10->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
            SPxOut::
            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[34],_int,_0>
                      (in_RDI,(char (*) [34])"IMAISM53 {} duplicate rows found\n",&local_8f8);
            pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
            iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar10->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            piVar8 = DataArray<int>::operator[](&in_RDI->m_stat,0xc);
            *piVar8 = iVar6 + -1 + *piVar8;
            local_8fc = -1;
            local_900 = -1;
            local_904 = -1;
            puVar14 = (ulong *)infinity();
            local_948 = *puVar14 ^ 0x8000000000000000;
            local_4d8 = &local_93c;
            local_4e0 = &local_948;
            local_4e8 = 0;
            local_220 = local_4e0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                       (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
            local_4c8 = infinity();
            local_4c0 = local_9b8;
            local_4d0 = 0;
            local_228 = local_4c8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                       (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
            boost::multiprecision::operator+
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffec98);
            pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(&pDVar10->
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
            DataArray<bool>::DataArray
                      ((DataArray<bool> *)
                       CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                       (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20),
                       (int)in_stack_ffffffffffffeca8,(Real)in_stack_ffffffffffffeca0);
            local_9d4 = 0;
            while( true ) {
              uVar17 = local_9d4;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar10->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              i_00 = (int)((ulong)in_stack_ffffffffffffec98 >> 0x20);
              if (iVar5 <= (int)uVar17) break;
              pDVar10 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)in_stack_ffffffffffffeca0,i_00);
              piVar8 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::index(&pDVar10->
                                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ,(char *)(ulong)local_9d4,__c_05);
              local_9d8 = *piVar8;
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              in_stack_ffffffffffffeed7 =
                   boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffec98,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x414adc);
              pbVar12 = DataArray<bool>::operator[](&local_9d0,local_9d4);
              *pbVar12 = (bool)(in_stack_ffffffffffffeed7 & 1);
              if (local_8fc == -1) {
                local_8fc = local_9d8;
                in_stack_ffffffffffffeec8 =
                     (DataArray<int> *)
                     SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20)
                          );
                local_290 = &local_93c;
                local_298 = in_stack_ffffffffffffeec8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                in_stack_ffffffffffffeec0 =
                     SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::rhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20)
                          );
                local_2a0 = &stack0xfffffffffffff680;
                local_2a8 = in_stack_ffffffffffffeec0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              }
              else {
                local_3f8 = local_a10;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                local_3f0 = local_a48;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                pnVar15 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffeca0,
                                       (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                local_1f8 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffeca0,
                                         (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                local_1f0 = pnVar15;
                local_1e8 = &local_a80;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1f9,pnVar15,local_1f8);
                local_1e0 = &local_a80;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                local_1d0 = local_1f0;
                local_1d8 = local_1f8;
                local_1c8 = &local_a80;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                           (cpp_dec_float<50U,_int,_void> *)0x414d40);
                local_a84 = 0;
                tVar2 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffeca8,(int *)in_stack_ffffffffffffeca0);
                iVar5 = (int)((ulong)in_stack_ffffffffffffec98 >> 0x20);
                if (tVar2) {
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs(in_stack_ffffffffffffeca0,iVar5);
                  puVar14 = (ulong *)infinity();
                  local_b00 = *puVar14 ^ 0x8000000000000000;
                  local_4a8 = local_af4;
                  local_4b0 = &local_b00;
                  local_4b8 = 0;
                  local_230 = local_4b0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                             (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  tVar2 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffec98,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x414e2a);
                  if (tVar2) {
                    puVar14 = (ulong *)infinity();
                    local_b08 = *puVar14 ^ 0x8000000000000000;
                    local_490 = local_abc;
                    local_498 = &local_b08;
                    local_4a0 = 0;
                    local_238 = local_498;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                               (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  }
                  else {
                    local_b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::lhs(in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                    local_b8 = &local_a80;
                    local_a8 = local_abc;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_b9,local_b0,local_b8);
                    local_a0 = local_abc;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                    local_90 = local_b0;
                    local_98 = local_b8;
                    local_88 = local_abc;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                               (cpp_dec_float<50U,_int,_void> *)0x414f9c);
                  }
                  local_300 = local_a10;
                  local_308 = local_abc;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                  local_480 = infinity();
                  local_478 = local_b78;
                  local_488 = 0;
                  local_240 = local_480;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                             (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  tVar2 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffec98,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x415064);
                  if (tVar2) {
                    local_468 = infinity();
                    local_460 = local_b40;
                    local_470 = 0;
                    local_248 = local_468;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                               (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  }
                  else {
                    local_f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::rhs(in_stack_ffffffffffffeca0,
                                     (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                    local_f8 = &local_a80;
                    local_e8 = local_b40;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_f9,local_f0,local_f8);
                    local_e0 = local_b40;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                    local_d0 = local_f0;
                    local_d8 = local_f8;
                    local_c8 = local_b40;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                               (cpp_dec_float<50U,_int,_void> *)0x4151b6);
                  }
                  local_310 = local_a48;
                  local_318 = local_b40;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                }
                else {
                  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_ffffffffffffeca0,iVar5);
                  local_450 = infinity();
                  local_448 = local_be8;
                  local_458 = 0;
                  local_250 = local_450;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                             (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  in_stack_ffffffffffffee57 =
                       boost::multiprecision::operator>=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffec98,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x415283);
                  if ((bool)in_stack_ffffffffffffee57) {
                    puVar14 = (ulong *)infinity();
                    local_bf0 = (pointer)(*puVar14 ^ 0x8000000000000000);
                    local_430 = local_bb0;
                    local_438 = &local_bf0;
                    local_440 = 0;
                    local_258 = local_438;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                               (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  }
                  else {
                    in_stack_ffffffffffffee48 =
                         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::rhs(in_stack_ffffffffffffeca0,
                                  (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                    in_stack_ffffffffffffee40 = local_bb0;
                    local_138 = &local_a80;
                    local_130 = in_stack_ffffffffffffee48;
                    local_128 = in_stack_ffffffffffffee40;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_139,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffee48,local_138);
                    local_120 = in_stack_ffffffffffffee40;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                    local_110 = local_130;
                    local_118 = local_138;
                    local_108 = in_stack_ffffffffffffee40;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                               (cpp_dec_float<50U,_int,_void> *)0x4153f5);
                  }
                  local_320 = local_a10;
                  local_328 = local_bb0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                  in_stack_ffffffffffffee38 =
                       SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::lhs(in_stack_ffffffffffffeca0,
                             (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                  puVar14 = (ulong *)infinity();
                  local_c68 = (SPxOut *)(*puVar14 ^ 0x8000000000000000);
                  local_418 = local_c60;
                  local_420 = &local_c68;
                  local_428 = 0;
                  local_260 = local_420;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                             (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  in_stack_ffffffffffffee37 =
                       boost::multiprecision::operator<=
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffec98,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x4154dd);
                  if ((bool)in_stack_ffffffffffffee37) {
                    local_408 = infinity();
                    local_400 = local_c28;
                    local_410 = 0;
                    local_268 = local_408;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                               (double)in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
                  }
                  else {
                    in_stack_ffffffffffffee28 =
                         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::lhs(in_stack_ffffffffffffeca0,
                               (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                    local_178 = &local_a80;
                    local_170 = in_stack_ffffffffffffee28;
                    local_168 = local_c28;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_179,in_stack_ffffffffffffee28,local_178);
                    local_160 = local_c28;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
                    local_150 = local_170;
                    local_158 = local_178;
                    local_148 = local_c28;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,
                               (cpp_dec_float<50U,_int,_void> *)0x41562f);
                  }
                  local_330 = local_a48;
                  local_338 = local_c28;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                }
                tVar2 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffec98,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x41567f);
                if (tVar2) {
                  local_2b0 = &local_93c;
                  local_2b8 = local_a10;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                  local_900 = local_9d8;
                }
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffec98,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x4156ed);
                if (tVar2) {
                  local_2c0 = &stack0xfffffffffffff680;
                  local_2c8 = local_a48;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                  local_904 = local_9d8;
                }
                pbVar12 = DataArray<bool>::operator[](local_840,local_9d8);
                *pbVar12 = true;
              }
              local_9d4 = local_9d4 + 1;
            }
            if (local_8fc == -1) {
LAB_00416442:
              local_f98 = 0;
            }
            else {
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffeca0,i_00);
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffec98,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x4157b6);
              if (tVar2) {
                local_1200 = &local_93c;
              }
              else {
                local_1200 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::lhs(in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              }
              local_3b0 = &local_ca0;
              local_3b8 = local_1200;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              tVar2 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffec98,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x415876);
              if (tVar2) {
                local_1220 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&stack0xfffffffffffff680;
              }
              else {
                local_1220 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::rhs(in_stack_ffffffffffffeca0,
                                   (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              }
              local_3a0 = &local_cd8;
              local_3a8 = local_1220;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              iVar5 = (int)((ulong)in_stack_ffffffffffffeca8 >> 0x20);
              if (local_8f4 == local_8a4) {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),iVar5,
                           (int)in_stack_ffffffffffffeca8,(Real)in_stack_ffffffffffffeca0);
                for (local_cf4 = 0; local_cf4 < local_88c; local_cf4 = local_cf4 + 1) {
                  iVar5 = *(int *)(local_898 + (long)local_cf4 * 4);
                  piVar8 = DataArray<int>::operator[](&local_cf0,local_cf4);
                  *piVar8 = iVar5;
                }
                operator_new(0x100);
                local_de1 = 1;
                Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)in_stack_ffffffffffffeca0,
                             (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                        (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffeca8);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                           (DataArray<int> *)in_stack_ffffffffffffeca8);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                           in_stack_ffffffffffffeca8);
                local_390 = &stack0xfffffffffffff278;
                local_398 = &local_ca0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                local_380 = local_de0.m_backend.data._M_elems + 8;
                local_388 = &local_cd8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffec98);
                peVar11 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x415aee);
                Tolerances::epsilon(peVar11);
                in_stack_ffffffffffffed97 =
                     EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT17(in_stack_ffffffffffffed97,in_stack_ffffffffffffed90),
                                in_stack_ffffffffffffed88,(double)in_stack_ffffffffffffed80);
                in_stack_ffffffffffffed88 = &local_de0;
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffeca0,
                           (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffec98);
                in_stack_ffffffffffffeca8 = &local_d50;
                in_stack_ffffffffffffeca0 =
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)local_d38;
                in_stack_ffffffffffffec98 = (DuplicateRowsPS *)(local_d38 + 0x18);
                in_stack_ffffffffffffecb0 = 1;
                DuplicateRowsPS::DuplicateRowsPS
                          ((DuplicateRowsPS *)
                           CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                           in_stack_ffffffffffffee48,(int)((ulong)in_stack_ffffffffffffee40 >> 0x20)
                           ,(int)in_stack_ffffffffffffee40,
                           (int)((ulong)in_stack_ffffffffffffee38 >> 0x20),
                           (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT17(in_stack_ffffffffffffee37,in_stack_ffffffffffffee30),
                           (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffeec0,in_stack_ffffffffffffeec8,
                           (DataArray<bool> *)
                           CONCAT17(in_stack_ffffffffffffeed7,in_stack_ffffffffffffeed0),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x38,0),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x30,0),
                           (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,uVar17),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x28,0));
                local_de1 = 0;
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                ::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x415c13);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x415c20);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffeca0);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x415c47);
                Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          *)in_stack_ffffffffffffeca0,
                         (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)in_stack_ffffffffffffec98);
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                               *)0x415c72);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
              }
              else {
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),iVar5,
                           (int)in_stack_ffffffffffffeca8,(Real)in_stack_ffffffffffffeca0);
                in_stack_ffffffffffffed80 =
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)operator_new(0x100);
                local_ee9 = 1;
                Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              *)in_stack_ffffffffffffeca0,
                             (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                        (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_ffffffffffffeca8);
                DataArray<int>::DataArray
                          ((DataArray<int> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                           (DataArray<int> *)in_stack_ffffffffffffeca8);
                DataArray<bool>::DataArray
                          ((DataArray<bool> *)
                           CONCAT44(in_stack_ffffffffffffecb4,in_stack_ffffffffffffecb0),
                           in_stack_ffffffffffffeca8);
                local_370 = local_e90;
                local_378 = &local_ca0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                local_360 = local_ec8;
                local_368 = &local_cd8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffec98);
                peVar11 = std::
                          __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x415f0d);
                Tolerances::epsilon(peVar11);
                EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT17(in_stack_ffffffffffffed97,in_stack_ffffffffffffed90),
                           in_stack_ffffffffffffed88,(double)in_stack_ffffffffffffed80);
                std::shared_ptr<soplex::Tolerances>::shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffeca0,
                           (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffec98);
                in_stack_ffffffffffffeca8 = local_e58;
                in_stack_ffffffffffffeca0 =
                     (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(local_e58 + 1);
                in_stack_ffffffffffffec98 = (DuplicateRowsPS *)(local_e58 + 2);
                in_stack_ffffffffffffecb0 = 0;
                DuplicateRowsPS::DuplicateRowsPS
                          ((DuplicateRowsPS *)
                           CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                           in_stack_ffffffffffffee48,(int)((ulong)in_stack_ffffffffffffee40 >> 0x20)
                           ,(int)in_stack_ffffffffffffee40,
                           (int)((ulong)in_stack_ffffffffffffee38 >> 0x20),
                           (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT17(in_stack_ffffffffffffee37,in_stack_ffffffffffffee30),
                           (Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_ffffffffffffeec0,in_stack_ffffffffffffeec8,
                           (DataArray<bool> *)
                           CONCAT17(in_stack_ffffffffffffeed7,in_stack_ffffffffffffeed0),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x38,0),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x30,0),
                           (shared_ptr<soplex::Tolerances> *)CONCAT44(iVar6,uVar17),
                           SUB81((ulong)in_stack_ffffffffffffee28 >> 0x28,0));
                local_ee9 = 0;
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                ::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                          ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x416032);
                std::shared_ptr<soplex::Tolerances>::~shared_ptr
                          ((shared_ptr<soplex::Tolerances> *)0x41603f);
                DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffeca0);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
                Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x416066);
                Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          *)in_stack_ffffffffffffeca0,
                         (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)in_stack_ffffffffffffec98);
                std::
                shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                               *)0x416091);
                DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
              }
              SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
              tVar2 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffec98,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x4161f2);
              if (!tVar2) {
                SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rhs(in_stack_ffffffffffffeca0,(int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffec98,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x41623b);
                if (!tVar2) goto LAB_00416442;
              }
              local_8bd = 1;
              local_350 = local_f24;
              local_358 = &local_cd8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              local_340 = local_f5c;
              local_348 = &local_ca0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
              feastol((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffecdc,in_stack_ffffffffffffecd8));
              bVar3 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT17(in_stack_ffffffffffffed97,in_stack_ffffffffffffed90),
                                 in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
              if (!bVar3) {
                tVar2 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_ffffffffffffec98,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x416373);
                if (tVar2) {
                  local_2d0 = &local_cd8;
                  local_2d8 = &local_ca0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                }
                local_2e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffeca0,
                                         (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                local_2e8 = &local_ca0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                local_2f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffeca0,
                                         (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
                local_2f8 = &local_cd8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                          ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                           (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98);
                goto LAB_00416442;
              }
              SPxOut::
              debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[64],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                        (in_RDI,(char (*) [64])
                                "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n",
                         &local_ca0,&local_cd8);
              spx_free<int*>((int **)0x416343);
              local_534 = INFEASIBLE;
              local_f98 = 1;
            }
            DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffeca0);
            if (local_f98 != 0) goto LAB_00416929;
          }
        }
      }
      if ((local_8bd & 1) != 0) {
        (**(code **)(*local_548 + 0x1c0))(local_548,local_8d8,local_8f0,0);
      }
      local_f9c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x4164d8);
      local_fa8 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffece0,in_stack_ffffffffffffecdc);
      for (local_fac = 0; local_fac < local_f9c; local_fac = local_fac + 1) {
        pbVar12 = DataArray<bool>::operator[](local_840,local_fac);
        if ((*pbVar12 & 1U) == 0) {
          *(undefined4 *)(local_fa8 + (long)local_fac * 4) = 0;
        }
        else {
          *(undefined4 *)(local_fa8 + (long)local_fac * 4) = 0xffffffff;
          local_554 = local_554 + 1;
          pSVar13 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector(in_stack_ffffffffffffeca0,
                                (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          iVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar13);
          local_558 = iVar6 + local_558;
        }
      }
      (**(code **)(*local_548 + 0x88))(local_548,local_fa8);
      for (local_fb0 = 0; local_fb0 < local_f9c; local_fb0 = local_fb0 + 1) {
        if (-1 < *(int *)(local_fa8 + (long)local_fb0 * 4)) {
          piVar8 = DataArray<int>::operator[](&in_RDI->m_rIdx,local_fb0);
          iVar6 = *piVar8;
          piVar8 = DataArray<int>::operator[]
                             (&in_RDI->m_rIdx,*(int *)(local_fa8 + (long)local_fb0 * 4));
          *piVar8 = iVar6;
        }
      }
      spx_free<int*>((int **)0x41669c);
      spx_free<int*>((int **)0x4166a9);
      if (0 < local_554 + local_558) {
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remRows = local_554 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remRows;
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remNzos = local_558 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remNzos;
        if (((in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout != (SPxOut *)0x0) &&
           (VVar7 = SPxOut::getVerbosity
                              ((in_RDI->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout), 3 < (int)VVar7)) {
          local_fb4 = SPxOut::getVerbosity
                                ((in_RDI->
                                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).spxout);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          local_fb8 = 4;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_fb8);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                             (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                             (int)((ulong)in_stack_ffffffffffffec98 >> 0x20));
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,(char *)in_stack_ffffffffffffec98);
          soplex::operator<<((SPxOut *)in_stack_ffffffffffffeca0,
                             (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffec98);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_fb4);
        }
        local_38 = &(in_RDI->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction;
        puVar16 = local_ff0;
        local_40 = &local_55c;
        local_30 = puVar16;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_41,local_38);
        local_28 = puVar16;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0);
        local_18 = local_38;
        local_20 = local_40;
        local_50 = (long)*local_40;
        local_10 = puVar16;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffeca0,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffec98,(longlong *)0x4168dd);
        tVar2 = boost::multiprecision::operator>
                          (&in_stack_ffffffffffffeca8->thesize,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffeca0);
        if (tVar2) {
          *local_550 = 1;
        }
      }
      local_534 = OKAY;
      local_f98 = 1;
LAB_00416929:
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x416936);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x416943);
      DataArray<bool>::~DataArray((DataArray<bool> *)in_stack_ffffffffffffeca0);
      IdxSet::~IdxSet((IdxSet *)in_stack_ffffffffffffeca0);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x41696a);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
      DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffeca0);
      RVar4 = local_534;
    }
  }
  local_534 = RVar4;
  return local_534;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}